

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O2

void P_FloodZones(void)

{
  zone_t *pzVar1;
  int iVar2;
  ReverbContainer *pRVar3;
  ulong uVar4;
  uint amount;
  ulong uVar5;
  long lVar6;
  long lVar7;
  
  lVar6 = 0;
  amount = 0;
  iVar2 = numsectors;
  for (lVar7 = 0; lVar7 < iVar2; lVar7 = lVar7 + 1) {
    if (*(short *)((long)sectors->Portals + lVar6 + -0x14) == -1) {
      P_FloodZone((sector_t_conflict *)((long)&sectors->planes[0].xform.xOffs + lVar6),amount);
      iVar2 = numsectors;
      amount = amount + 1;
    }
    lVar6 = lVar6 + 0x218;
  }
  TArray<zone_t,_zone_t>::Resize(&Zones,amount);
  pRVar3 = S_FindEnvironment(level.DefaultEnvironment);
  if (pRVar3 == (ReverbContainer *)0x0) {
    Printf("Sound environment %d, %d not found\n",(ulong)(uint)(level.DefaultEnvironment >> 8),
           (ulong)(level.DefaultEnvironment & 0xff));
    pRVar3 = DefaultEnvironments[0];
  }
  pzVar1 = Zones.Array;
  uVar4 = 0;
  uVar5 = (ulong)amount;
  if ((int)amount < 1) {
    uVar5 = uVar4;
  }
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    pzVar1[uVar4].Environment = pRVar3;
  }
  return;
}

Assistant:

void P_FloodZones ()
{
	int z = 0, i;
	ReverbContainer *reverb;

	for (i = 0; i < numsectors; ++i)
	{
		if (sectors[i].ZoneNumber == 0xFFFF)
		{
			P_FloodZone (&sectors[i], z++);
		}
	}
	Zones.Resize(z);
	reverb = S_FindEnvironment(level.DefaultEnvironment);
	if (reverb == NULL)
	{
		Printf("Sound environment %d, %d not found\n", level.DefaultEnvironment >> 8, level.DefaultEnvironment & 255);
		reverb = DefaultEnvironments[0];
	}
	for (i = 0; i < z; ++i)
	{
		Zones[i].Environment = reverb;
	}
}